

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::sse2::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  RawBufferView *pRVar1;
  PrimRefMB *pPVar2;
  Vec3fx *pVVar3;
  float *pfVar4;
  BBox1f BVar5;
  PrimRefMB *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  LBBox3fx *pLVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  Grid *pGVar18;
  undefined4 uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  size_t sVar25;
  size_t *psVar26;
  int iVar27;
  size_t x;
  ulong uVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  uint uVar40;
  float fVar41;
  uint uVar43;
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float local_27c;
  float local_278;
  size_t local_220;
  size_t local_200;
  unsigned_long local_1f8;
  size_t local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  ulong local_128;
  ulong local_120;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_32_4_e9707c6d local_d8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  local_1e0 = k;
  uVar16 = r->_begin;
  local_198 = ZEXT816(0x3f80000000000000);
  local_1f8 = 0;
  local_27c = 0.0;
  local_278 = 1.0;
  local_1a8._8_8_ = 0xff800000ff800000;
  local_1a8._0_8_ = 0xff800000ff800000;
  local_1b8._8_8_ = 0x7f8000007f800000;
  local_1b8._0_8_ = 0x7f8000007f800000;
  local_220 = 0;
  local_200 = 0;
  local_178._8_8_ = 0xff800000ff800000;
  local_178._0_8_ = 0xff800000ff800000;
  local_1c8._8_8_ = 0xff800000ff800000;
  local_1c8._0_8_ = 0xff800000ff800000;
  local_188._8_8_ = 0x7f8000007f800000;
  local_188._0_8_ = 0x7f8000007f800000;
  local_1d8._8_8_ = 0x7f8000007f800000;
  local_1d8._0_8_ = 0x7f8000007f800000;
  do {
    if (r->_end <= uVar16) {
      (__return_storage_ptr__->object_range)._end = local_1f8;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_1d8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_1d8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_1c8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_1c8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_1b8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_1b8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_1a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_1a8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_188._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_178._8_8_;
      (__return_storage_ptr__->time_range).lower = local_278;
      (__return_storage_ptr__->time_range).upper = local_27c;
      __return_storage_ptr__->num_time_segments = local_200;
      __return_storage_ptr__->max_num_time_segments = local_220;
      (__return_storage_ptr__->max_time_range).lower = (float)local_198._0_4_;
      (__return_storage_ptr__->max_time_range).upper = (float)local_198._4_4_;
      return __return_storage_ptr__;
    }
    BVar5 = (this->super_GridMesh).super_Geometry.time_range;
    fVar47 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
    fVar31 = t0t1->upper;
    fVar35 = BVar5.lower;
    fVar39 = BVar5.upper - fVar35;
    fVar30 = floorf(((t0t1->lower - fVar35) / fVar39) * 1.0000002 * fVar47);
    fVar31 = ceilf(((fVar31 - fVar35) / fVar39) * 0.99999976 * fVar47);
    if (uVar16 < *(ulong *)&(this->super_GridMesh).field_0x70) {
      lVar13 = *(long *)&(this->super_GridMesh).field_0x68 * uVar16;
      lVar20 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
      uVar22 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
      uVar21 = *(uint *)(lVar20 + lVar13);
      if (uVar21 < uVar22) {
        pGVar18 = (Grid *)(lVar20 + lVar13);
        uVar15 = (ulong)pGVar18->resY;
        uVar14 = (ulong)pGVar18->resX;
        if ((pGVar18->lineVtxOffset * (pGVar18->resY - 1) + uVar21 + (uint)pGVar18->resX) - 1 <
            uVar22) {
          fVar35 = 0.0;
          if (0.0 <= fVar30) {
            fVar35 = fVar30;
          }
          if (fVar47 <= fVar31) {
            fVar31 = fVar47;
          }
          for (uVar22 = 0; uVar22 != uVar15; uVar22 = uVar22 + 1) {
            for (uVar28 = 0; uVar28 != uVar14; uVar28 = uVar28 + 1) {
              uVar24 = (long)(int)fVar35 - 1;
              psVar26 = &(this->super_GridMesh).vertices.items[(int)fVar35].super_RawBufferView.
                         stride;
              while (uVar24 = uVar24 + 1, uVar24 <= (ulong)(long)(int)fVar31) {
                pRVar1 = (RawBufferView *)(psVar26 + -2);
                sVar25 = *psVar26;
                psVar26 = psVar26 + 7;
                lVar20 = sVar25 * (uVar22 * pGVar18->lineVtxOffset + (ulong)uVar21 + uVar28);
                pfVar4 = (float *)(pRVar1->ptr_ofs + lVar20);
                auVar34._0_4_ = -(uint)(*pfVar4 < 1.844e+18 && -1.844e+18 < *pfVar4);
                auVar34._4_4_ = -(uint)(pfVar4[1] < 1.844e+18 && -1.844e+18 < pfVar4[1]);
                auVar34._8_4_ = -(uint)(pfVar4[2] < 1.844e+18 && -1.844e+18 < pfVar4[2]);
                auVar34._12_4_ = -(uint)(pfVar4[3] < 1.844e+18 && -1.844e+18 < pfVar4[3]);
                uVar19 = movmskps((int)lVar20,auVar34);
                if ((~(byte)uVar19 & 7) != 0) goto LAB_002567ba;
              }
            }
          }
          uVar22 = 0;
          while (uVar21 = (uint)uVar22, uVar21 < (int)uVar15 - 1U) {
            uVar15 = 0;
            while (uVar17 = (uint)uVar15, uVar17 < (int)uVar14 - 1U) {
              local_d8.sx = &local_120;
              local_d8.sy = &local_128;
              fVar47 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
              fVar31 = (this->super_GridMesh).super_Geometry.time_range.lower;
              fVar35 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar31;
              fVar39 = (t0t1->lower - fVar31) / fVar35;
              fVar35 = (t0t1->upper - fVar31) / fVar35;
              fVar44 = fVar47 * fVar35;
              local_128 = uVar22;
              local_120 = uVar15;
              local_d8.this = &this->super_GridMesh;
              local_d8.g = pGVar18;
              fVar31 = floorf(fVar47 * fVar39);
              fVar30 = ceilf(fVar44);
              iVar23 = (int)fVar31;
              if (fVar31 <= 0.0) {
                fVar31 = 0.0;
              }
              fVar36 = fVar30;
              if (fVar47 <= fVar30) {
                fVar36 = fVar47;
              }
              iVar27 = -1;
              if (-1 < iVar23) {
                iVar27 = iVar23;
              }
              iVar11 = (int)fVar47 + 1;
              if ((int)fVar30 < (int)fVar47 + 1) {
                iVar11 = (int)fVar30;
              }
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        (&blower0,&local_d8,(long)(int)fVar31);
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        (&bupper1,&local_d8,(long)(int)fVar36);
              fVar30 = fVar47 * fVar39 - fVar31;
              if (iVar11 - iVar27 == 1) {
                if (fVar30 <= 0.0) {
                  fVar30 = 0.0;
                }
                fVar47 = 1.0 - fVar30;
                fVar51 = fVar47 * blower0.lower.field_0.m128[0] +
                         fVar30 * bupper1.lower.field_0.m128[0];
                fVar52 = fVar47 * blower0.lower.field_0.m128[1] +
                         fVar30 * bupper1.lower.field_0.m128[1];
                fVar53 = fVar47 * blower0.lower.field_0.m128[2] +
                         fVar30 * bupper1.lower.field_0.m128[2];
                fVar31 = fVar47 * blower0.upper.field_0.m128[0] +
                         fVar30 * bupper1.upper.field_0.m128[0];
                fVar49 = fVar47 * blower0.upper.field_0.m128[1] +
                         fVar30 * bupper1.upper.field_0.m128[1];
                fVar50 = fVar47 * blower0.upper.field_0.m128[2] +
                         fVar30 * bupper1.upper.field_0.m128[2];
                fVar36 = fVar36 - fVar44;
                if (fVar36 <= 0.0) {
                  fVar36 = 0.0;
                }
                fVar47 = 1.0 - fVar36;
                fVar55 = bupper1.lower.field_0.m128[0] * fVar47 +
                         blower0.lower.field_0.m128[0] * fVar36;
                fVar56 = bupper1.lower.field_0.m128[1] * fVar47 +
                         blower0.lower.field_0.m128[1] * fVar36;
                fVar57 = bupper1.lower.field_0.m128[2] * fVar47 +
                         blower0.lower.field_0.m128[2] * fVar36;
                fVar44 = fVar47 * bupper1.upper.field_0.m128[0] +
                         fVar36 * blower0.upper.field_0.m128[0];
                fVar45 = fVar47 * bupper1.upper.field_0.m128[1] +
                         fVar36 * blower0.upper.field_0.m128[1];
                fVar46 = fVar47 * bupper1.upper.field_0.m128[2] +
                         fVar36 * blower0.upper.field_0.m128[2];
              }
              else {
                GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                          (&blower1,&local_d8,(long)((int)fVar31 + 1));
                GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                          (&bupper0,&local_d8,(long)((int)fVar36 + -1));
                if (fVar30 <= 0.0) {
                  fVar30 = 0.0;
                }
                fVar48 = 1.0 - fVar30;
                fVar51 = blower0.lower.field_0.m128[0] * fVar48 +
                         blower1.lower.field_0.m128[0] * fVar30;
                fVar52 = blower0.lower.field_0.m128[1] * fVar48 +
                         blower1.lower.field_0.m128[1] * fVar30;
                fVar53 = blower0.lower.field_0.m128[2] * fVar48 +
                         blower1.lower.field_0.m128[2] * fVar30;
                fVar54 = blower0.lower.field_0.m128[3] * fVar48 +
                         blower1.lower.field_0.m128[3] * fVar30;
                fVar31 = fVar48 * blower0.upper.field_0.m128[0] +
                         fVar30 * blower1.upper.field_0.m128[0];
                fVar49 = fVar48 * blower0.upper.field_0.m128[1] +
                         fVar30 * blower1.upper.field_0.m128[1];
                fVar50 = fVar48 * blower0.upper.field_0.m128[2] +
                         fVar30 * blower1.upper.field_0.m128[2];
                fVar30 = fVar48 * blower0.upper.field_0.m128[3] +
                         fVar30 * blower1.upper.field_0.m128[3];
                fVar36 = fVar36 - fVar44;
                if (fVar36 <= 0.0) {
                  fVar36 = 0.0;
                }
                fVar48 = 1.0 - fVar36;
                fVar55 = bupper1.lower.field_0.m128[0] * fVar48 +
                         bupper0.lower.field_0.m128[0] * fVar36;
                fVar56 = bupper1.lower.field_0.m128[1] * fVar48 +
                         bupper0.lower.field_0.m128[1] * fVar36;
                fVar57 = bupper1.lower.field_0.m128[2] * fVar48 +
                         bupper0.lower.field_0.m128[2] * fVar36;
                fVar58 = bupper1.lower.field_0.m128[3] * fVar48 +
                         bupper0.lower.field_0.m128[3] * fVar36;
                fVar44 = fVar48 * bupper1.upper.field_0.m128[0] +
                         fVar36 * bupper0.upper.field_0.m128[0];
                fVar45 = fVar48 * bupper1.upper.field_0.m128[1] +
                         fVar36 * bupper0.upper.field_0.m128[1];
                fVar46 = fVar48 * bupper1.upper.field_0.m128[2] +
                         fVar36 * bupper0.upper.field_0.m128[2];
                fVar36 = fVar48 * bupper1.upper.field_0.m128[3] +
                         fVar36 * bupper0.upper.field_0.m128[3];
                if (iVar23 < 0) {
                  iVar23 = -1;
                }
                sVar25 = (size_t)iVar23;
                while (sVar25 = sVar25 + 1, (long)sVar25 < (long)iVar11) {
                  fVar48 = ((float)(int)sVar25 / fVar47 - fVar39) / (fVar35 - fVar39);
                  fVar41 = 1.0 - fVar48;
                  local_a8 = fVar51 * fVar41 + fVar55 * fVar48;
                  fStack_a4 = fVar52 * fVar41 + fVar56 * fVar48;
                  fStack_a0 = fVar53 * fVar41 + fVar57 * fVar48;
                  fStack_9c = fVar54 * fVar41 + fVar58 * fVar48;
                  local_b8 = fVar41 * fVar31 + fVar48 * fVar44;
                  fStack_b4 = fVar41 * fVar49 + fVar48 * fVar45;
                  fStack_b0 = fVar41 * fVar50 + fVar48 * fVar46;
                  fStack_ac = fVar41 * fVar30 + fVar48 * fVar36;
                  GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()(&bi,&local_d8,sVar25)
                  ;
                  auVar38._0_4_ = bi.lower.field_0.m128[0] - local_a8;
                  auVar38._4_4_ = bi.lower.field_0.m128[1] - fStack_a4;
                  auVar38._8_4_ = bi.lower.field_0.m128[2] - fStack_a0;
                  auVar38._12_4_ = bi.lower.field_0.m128[3] - fStack_9c;
                  auVar37._0_4_ = bi.upper.field_0.m128[0] - local_b8;
                  auVar37._4_4_ = bi.upper.field_0.m128[1] - fStack_b4;
                  auVar37._8_4_ = bi.upper.field_0.m128[2] - fStack_b0;
                  auVar37._12_4_ = bi.upper.field_0.m128[3] - fStack_ac;
                  auVar34 = minps(auVar38,ZEXT816(0));
                  auVar38 = maxps(auVar37,ZEXT816(0));
                  fVar51 = fVar51 + auVar34._0_4_;
                  fVar52 = fVar52 + auVar34._4_4_;
                  fVar53 = fVar53 + auVar34._8_4_;
                  fVar54 = fVar54 + auVar34._12_4_;
                  fVar55 = fVar55 + auVar34._0_4_;
                  fVar56 = fVar56 + auVar34._4_4_;
                  fVar57 = fVar57 + auVar34._8_4_;
                  fVar58 = fVar58 + auVar34._12_4_;
                  fVar31 = fVar31 + auVar38._0_4_;
                  fVar49 = fVar49 + auVar38._4_4_;
                  fVar50 = fVar50 + auVar38._8_4_;
                  fVar30 = fVar30 + auVar38._12_4_;
                  fVar44 = fVar44 + auVar38._0_4_;
                  fVar45 = fVar45 + auVar38._4_4_;
                  fVar46 = fVar46 + auVar38._8_4_;
                  fVar36 = fVar36 + auVar38._12_4_;
                }
              }
              fVar47 = (float)((this->super_GridMesh).super_Geometry.numTimeSteps - 1);
              uVar14 = (ulong)(uint)fVar47;
              fVar30 = (float)local_1e0;
              local_1f8 = local_1f8 + 1;
              local_200 = local_200 + uVar14;
              bVar29 = local_220 < uVar14;
              if (local_220 <= uVar14) {
                local_220 = uVar14;
              }
              auVar32._0_4_ = fVar31 * 0.5 + fVar44 * 0.5 + fVar51 * 0.5 + fVar55 * 0.5;
              auVar32._4_4_ = fVar49 * 0.5 + fVar45 * 0.5 + fVar52 * 0.5 + fVar56 * 0.5;
              auVar32._8_4_ = fVar50 * 0.5 + fVar46 * 0.5 + fVar53 * 0.5 + fVar57 * 0.5;
              auVar32._12_4_ = fVar30 * 0.5 + fVar47 * 0.5 + (float)geomID * 0.5 + fVar47 * 0.5;
              BVar5 = (this->super_GridMesh).super_Geometry.time_range;
              auVar9._4_4_ = fVar52;
              auVar9._0_4_ = fVar51;
              auVar9._8_4_ = fVar53;
              auVar9._12_4_ = geomID;
              local_1d8 = minps(local_1d8,auVar9);
              sgrids->items[local_1e0] =
                   (SubGridBuildData)
                   ((ulong)(uVar17 & 0xfffe | (uint)((uint)pGVar18->resX <= uVar17 + 2) << 0xf) |
                   (ulong)(uVar21 << 0x10 | (uint)((uint)pGVar18->resY <= uVar21 + 2) << 0x1f) |
                   uVar16 << 0x20);
              pPVar6 = prims->items;
              pPVar2 = pPVar6 + local_1e0;
              (pPVar2->lbounds).bounds0.lower.field_0.m128[0] = fVar51;
              (pPVar2->lbounds).bounds0.lower.field_0.m128[1] = fVar52;
              (pPVar2->lbounds).bounds0.lower.field_0.m128[2] = fVar53;
              (pPVar2->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
              auVar8._4_4_ = fVar49;
              auVar8._0_4_ = fVar31;
              auVar8._8_4_ = fVar50;
              auVar8._12_4_ = fVar30;
              local_1c8 = maxps(local_1c8,auVar8);
              pVVar3 = &pPVar6[local_1e0].lbounds.bounds0.upper;
              (pVVar3->field_0).m128[0] = fVar31;
              (pVVar3->field_0).m128[1] = fVar49;
              (pVVar3->field_0).m128[2] = fVar50;
              (pVVar3->field_0).m128[3] = fVar30;
              auVar10._4_4_ = fVar56;
              auVar10._0_4_ = fVar55;
              auVar10._8_4_ = fVar57;
              auVar10._12_4_ = fVar47;
              local_1b8 = minps(local_1b8,auVar10);
              pLVar12 = &pPVar6[local_1e0].lbounds;
              (pLVar12->bounds1).lower.field_0.m128[0] = fVar55;
              (pLVar12->bounds1).lower.field_0.m128[1] = fVar56;
              (pLVar12->bounds1).lower.field_0.m128[2] = fVar57;
              (pLVar12->bounds1).lower.field_0.m128[3] = fVar47;
              auVar7._4_4_ = fVar45;
              auVar7._0_4_ = fVar44;
              auVar7._8_4_ = fVar46;
              auVar7._12_4_ = fVar47;
              local_1a8 = maxps(local_1a8,auVar7);
              pVVar3 = &pPVar6[local_1e0].lbounds.bounds1.upper;
              (pVVar3->field_0).m128[0] = fVar44;
              (pVVar3->field_0).m128[1] = fVar45;
              (pVVar3->field_0).m128[2] = fVar46;
              (pVVar3->field_0).m128[3] = fVar47;
              pPVar6[local_1e0].time_range = BVar5;
              local_188 = minps(local_188,auVar32);
              local_178 = maxps(local_178,auVar32);
              fVar47 = BVar5.lower;
              if (fVar47 <= local_278) {
                local_278 = fVar47;
              }
              fVar30 = BVar5.upper;
              fVar31 = fVar30;
              if (fVar30 <= local_27c) {
                fVar31 = local_27c;
              }
              uVar40 = (int)((uint)bVar29 << 0x1f) >> 0x1f;
              uVar43 = (int)((uint)bVar29 << 0x1f) >> 0x1f;
              auVar33._0_4_ = (uint)fVar47 & uVar40;
              auVar33._4_4_ = (uint)fVar30 & uVar43;
              auVar33._8_8_ = 0;
              auVar42._0_4_ = ~uVar40 & local_198._0_4_;
              auVar42._4_4_ = ~uVar43 & local_198._4_4_;
              auVar42._8_4_ = local_198._8_4_;
              auVar42._12_4_ = local_198._12_4_;
              local_198 = auVar42 | auVar33;
              local_1e0 = local_1e0 + 1;
              uVar14 = (ulong)pGVar18->resX;
              local_27c = fVar31;
              uVar15 = (ulong)(uVar17 + 2);
            }
            uVar15 = (ulong)pGVar18->resY;
            uVar22 = (ulong)(uVar21 + 2);
          }
        }
      }
    }
LAB_002567ba:
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }